

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

int int32_put(cram_block *b,int32_t val)

{
  uchar *__ptr;
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  size_t __size;
  undefined1 auVar4 [16];
  double dVar5;
  
  __ptr = b->data;
  uVar1 = b->alloc;
  sVar3 = b->byte;
  if (uVar1 <= sVar3 + 4) {
    do {
      auVar4._8_4_ = (int)(uVar1 >> 0x20);
      auVar4._0_8_ = uVar1;
      auVar4._12_4_ = 0x45300000;
      dVar5 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
      uVar2 = (ulong)dVar5;
      __size = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
      if (uVar1 == 0) {
        __size = 0x400;
      }
      b->alloc = __size;
      __ptr = (uchar *)realloc(__ptr,__size);
      b->data = __ptr;
      uVar1 = b->alloc;
      sVar3 = b->byte;
    } while (uVar1 <= sVar3 + 4);
  }
  *(int32_t *)(__ptr + sVar3) = val;
  b->byte = b->byte + 4;
  return -(uint)(b->data == (uchar *)0x0);
}

Assistant:

int int32_put(cram_block *b, int32_t val) {
    unsigned char cp[4];
    cp[0] = ( val      & 0xff);
    cp[1] = ((val>>8)  & 0xff);
    cp[2] = ((val>>16) & 0xff);
    cp[3] = ((val>>24) & 0xff);

    BLOCK_APPEND(b, cp, 4);
    return b->data ? 0 : -1;
}